

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O2

void __thiscall WSNTopologyBasedEnergy::SelectLeaderID(WSNTopologyBasedEnergy *this)

{
  int iVar1;
  WSNNode *this_00;
  WSNTopologyBasedEnergy *this_01;
  long lVar2;
  WSNNode *this_02;
  vector<WSNNode,_std::allocator<WSNNode>_> *pvVar3;
  uint uVar4;
  long lVar5;
  allocator<char> local_d9;
  WSNNode *local_d8;
  WSNNode *local_d0;
  vector<WSNNode,_std::allocator<WSNNode>_> *local_c8;
  _InputArray local_c0;
  string local_a8 [32];
  WSNNode local_88;
  
  local_c8 = this->LayerLeaderSeq;
  local_d8 = this->node;
  local_d0 = this->LayerLeaderNode;
  uVar4 = 0;
LAB_0010630d:
  pvVar3 = local_c8 + uVar4;
  do {
    if (4 < uVar4) {
      return;
    }
    this_00 = (pvVar3->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar2 = -(long)this_00;
    lVar5 = 0;
    for (; this_00 !=
           (pvVar3->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
           super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      iVar1 = WSNNode::GetNodeID(this_00);
      if (this->ThresEnergy[uVar4] <= local_d8[iVar1].energy) {
        this_02 = local_d0 + uVar4;
        WSNNode::operator=(this_02,this_00);
        iVar1 = WSNNode::GetNodeID(this_02);
        WSNNode::WSNNode(&local_88,local_d8 + iVar1);
        iVar1 = WSNNode::GetNodeID(this_02);
        this_01 = (WSNTopologyBasedEnergy *)&stack0xffffffffffffffb0;
        WSNNode::NodeColor((Scalar *)&stack0xffffffffffffffb0,local_d8 + iVar1);
        drawCrossNode(this_01,&this->img,&local_88,(Scalar *)&stack0xffffffffffffffb0);
        WSNNode::~WSNNode(&local_88);
        std::__cxx11::string::string<std::allocator<char>>(local_a8,"WSN",&local_d9);
        local_c0.sz.width = 0;
        local_c0.sz.height = 0;
        local_c0.flags = 0x1010000;
        local_c0.obj = this;
        cv::imshow(local_a8,&local_c0);
        std::__cxx11::string::~string(local_a8);
        uVar4 = uVar4 + 1;
        goto LAB_0010630d;
      }
      lVar2 = lVar2 + -0x38;
      lVar5 = lVar5 + 1;
    }
    if (-((long)&(((pvVar3->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
                   super__Vector_impl_data._M_start)->color).super_Vec<double,_4>.
                 super_Matx<double,_4,_1> + lVar2 + -0x18) / 0x38 == lVar5) {
      this->ThresEnergy[uVar4] = this->ThresEnergy[uVar4] * 3.0 * 0.25;
      this->Mark[uVar4] = this->Mark[uVar4] + 1;
    }
  } while( true );
}

Assistant:

void WSNTopologyBasedEnergy::SelectLeaderID()
{
	vector<WSNNode>::iterator it;
	int i=0;
	while(i<LayerNum)
	{
		int j=0;
		bool   BREAK=false;
		for(it=LayerLeaderSeq[i].begin();it!=LayerLeaderSeq[i].end();it++)
		{
			if(node[it->GetNodeID()].energy>=ThresEnergy[i])
			{
				LayerLeaderNode[i]=*it;
				drawCrossNode(img,node[LayerLeaderNode[i].GetNodeID()],node[LayerLeaderNode[i].GetNodeID()].NodeColor());
				imshow("WSN",img);
				i++;
				BREAK=true;
				break;
			}
			j++;
		}
		if(BREAK) continue;
		if(j==LayerLeaderSeq[i].size())
		{
			ThresEnergy[i]=3*ThresEnergy[i]/4;
			Mark[i]++;
		}

	}
}